

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_linux.c
# Opt level: O2

uint8_t * os_fd_linux_skip_rawsocket_prefix(uint8_t *ptr,ssize_t *len,int af_type)

{
  ulong uVar1;
  
  if (af_type == 2) {
    uVar1 = (ulong)((*ptr & 0xf) << 2);
    *len = *len - uVar1;
    ptr = ptr + uVar1;
  }
  return ptr;
}

Assistant:

uint8_t *
os_fd_linux_skip_rawsocket_prefix(uint8_t *ptr, ssize_t *len, int af_type) {
  int header_size;

  if (af_type != AF_INET) {
    return ptr;
  }

  /* skip IPv4 header */
  header_size = (ptr[0] & 0x0f) << 2;

  *len -= header_size;
  return ptr + header_size;
}